

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::TransferProcessedObjects
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,FreeObject *list,FreeObject *tail)

{
  code *pcVar1;
  byte *pbVar2;
  uint uVar3;
  byte bVar4;
  bool bVar5;
  undefined4 *puVar6;
  FreeObject *this_00;
  FreeObject *this_01;
  uint i;
  
  if (tail == (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x68b,"(tail != nullptr)","tail != nullptr");
    if (!bVar5) goto LAB_006b72cc;
    *puVar6 = 0;
  }
  if (list == (FreeObject *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x68c,"(list)","list");
    if (!bVar5) {
LAB_006b72cc:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  tail->taggedNext = 1;
  if (list != (FreeObject *)0x0) {
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    this_01 = list;
    do {
      for (this_00 = this->freeObjectList; this_00 != (FreeObject *)0x0;
          this_00 = FreeObject::GetNext(this_00)) {
        if (this_00 == this_01) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                             ,0x693,"(!this->IsInFreeObjectList(freeObject))",
                             "!this->IsInFreeObjectList(freeObject)");
          if (!bVar5) goto LAB_006b72cc;
          *puVar6 = 0;
          break;
        }
      }
      if (((ulong)this_01 & 0xf) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.inl"
                           ,0x24d,"(HeapInfo::IsAlignedAddress(objectAddress))",
                           "HeapInfo::IsAlignedAddress(objectAddress)");
        if (!bVar5) goto LAB_006b72cc;
        *puVar6 = 0;
      }
      uVar3 = (uint)((ulong)this_01 >> 4);
      i = uVar3 & 0x7ff;
      BVStatic<2048UL>::AssertRange(&this->debugFreeBits,i);
      pbVar2 = (byte *)((long)&(this->debugFreeBits).data[0].word + ((long)(int)i >> 3));
      uVar3 = uVar3 & 7;
      bVar4 = *pbVar2;
      *pbVar2 = *pbVar2 | '\x01' << uVar3;
      if ((bVar4 >> uVar3 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                           ,0x695,"(!isSet)","!isSet");
        if (!bVar5) goto LAB_006b72cc;
        *puVar6 = 0;
      }
      this_01 = FreeObject::GetNext(this_01);
    } while (this_01 != (FreeObject *)0x0);
  }
  FreeObject::SetNext(tail,this->freeObjectList);
  this->freeObjectList = list;
  CheckDebugFreeBitVector(this,true);
  return;
}

Assistant:

void
SmallHeapBlockT<TBlockAttributes>::TransferProcessedObjects(FreeObject * list, FreeObject * tail)
{
    Assert(tail != nullptr);
    Assert(list);
#if DBG || defined(RECYCLER_STATS)
    // make sure that object we are transferred to the free list are not freed yet
    tail->SetNext(nullptr);
    FreeObject * freeObject = list;
    while (freeObject != nullptr)
    {
        Assert(!this->IsInFreeObjectList(freeObject));
        BOOL isSet = this->GetDebugFreeBitVector()->TestAndSet(GetAddressBitIndex(freeObject));
        Assert(!isSet);
        freeObject = freeObject->GetNext();
    }
#endif
    tail->SetNext(this->freeObjectList);
    this->freeObjectList = list;

    RECYCLER_SLOW_CHECK(this->CheckDebugFreeBitVector(true));
}